

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_103e4::TestBuildSystemFrontendDelegate::commandProcessStarted
          (TestBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle)

{
  int iVar1;
  int iVar2;
  StringRef Str;
  raw_ostream *prVar3;
  
  std::mutex::lock(&this->traceMutex);
  iVar2 = this->currentlyRunningTasks;
  iVar1 = iVar2 + 1;
  this->currentlyRunningTasks = iVar1;
  if (this->maxRunningTasks <= iVar2) {
    this->maxRunningTasks = iVar1;
  }
  prVar3 = llvm::raw_ostream::operator<<
                     (&(this->traceStream).super_raw_ostream,"commandProcessStarted");
  prVar3 = llvm::raw_ostream::operator<<(prVar3,": ");
  Str.Data = (command->name)._M_dataplus._M_p;
  Str.Length = (command->name)._M_string_length;
  prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
  llvm::raw_ostream::operator<<(prVar3,"\n");
  pthread_mutex_unlock((pthread_mutex_t *)&this->traceMutex);
  llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessStarted
            (&this->super_BuildSystemFrontendDelegate,command,handle);
  return;
}

Assistant:

virtual void commandProcessStarted(Command* command, ProcessHandle handle) override {
    {
      std::lock_guard<std::mutex> lock(traceMutex);

      // Keep track of max build parallelism
      currentlyRunningTasks++;
      if (currentlyRunningTasks > maxRunningTasks)
        maxRunningTasks = currentlyRunningTasks;

      traceStream << __func__ << ": " << command->getName() << "\n";
    }
    super::commandProcessStarted(command, handle);
  }